

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_39292::ParseDummyCommand::configureOutputs
          (ParseDummyCommand *this,ConfigureContext *param_1,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
          *outputs)

{
  pointer ppNVar1;
  pointer pcVar2;
  int iVar3;
  Node **node;
  pointer ppNVar4;
  char *pcVar5;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  iVar3 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar3 != '\0') {
    printf("  -- \'outputs\': [");
    ppNVar4 = (outputs->
              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppNVar1 = (outputs->
              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppNVar4 != ppNVar1) {
      pcVar5 = "";
      do {
        pcVar2 = ((*ppNVar4)->name)._M_dataplus._M_p;
        local_50 = &local_40;
        if (pcVar2 == (pointer)0x0) {
          local_48 = 0;
          local_40 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar2,pcVar2 + ((*ppNVar4)->name)._M_string_length);
        }
        printf("%s\'%s\'",pcVar5,local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        ppNVar4 = ppNVar4 + 1;
        pcVar5 = ", ";
      } while (ppNVar4 != ppNVar1);
    }
    puts("]");
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext&,
                                const std::vector<Node*>& outputs) override {
    if (delegate.shouldShowOutput()) {
      bool first = true;
      printf("  -- 'outputs': [");
      for (const auto& node: outputs) {
        printf("%s'%s'", first ? "" : ", ", node->getName().str().c_str());
        first = false;
      }
      printf("]\n");
    }
  }